

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O2

bool __thiscall
gss::innards::HomomorphismSearcher::both_in_the_neighbourhood_of_some_vertex
          (HomomorphismSearcher *this,uint v,uint w)

{
  bool bVar1;
  SVOBitset *pSVar2;
  SVOBitset i;
  SVOBitset local_a0;
  
  pSVar2 = HomomorphismModel::pattern_graph_row(this->model,0,v);
  SVOBitset::SVOBitset(&local_a0,pSVar2);
  pSVar2 = HomomorphismModel::pattern_graph_row(this->model,0,w);
  SVOBitset::operator&=(&local_a0,pSVar2);
  bVar1 = SVOBitset::any(&local_a0);
  SVOBitset::~SVOBitset(&local_a0);
  return bVar1;
}

Assistant:

auto HomomorphismSearcher::both_in_the_neighbourhood_of_some_vertex(unsigned v, unsigned w) -> bool
{
    auto i = model.pattern_graph_row(0, v);
    i &= model.pattern_graph_row(0, w);
    return i.any();
}